

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

void __thiscall
Assimp::FBXExporter::FBXExporter(FBXExporter *this,aiScene *pScene,ExportProperties *pProperties)

{
  _Rb_tree_header *p_Var1;
  
  this->binary = false;
  this->mScene = pScene;
  this->mProperties = pProperties;
  p_Var1 = &(this->node_uids)._M_t._M_impl.super__Rb_tree_header;
  memset(&this->outfile,0,0x88);
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->node_uids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_uid = 999999;
  return;
}

Assistant:

FBXExporter::FBXExporter ( const aiScene* pScene, const ExportProperties* pProperties )
: binary(false)
, mScene(pScene)
, mProperties(pProperties)
, outfile()
, connections()
, mesh_uids()
, material_uids()
, node_uids() {
    // will probably need to determine UIDs, connections, etc here.
    // basically anything that needs to be known
    // before we start writing sections to the stream.
}